

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<double> __thiscall
qclab::dense::operator+(dense *this,SquareMatrix<double> *lhs,SquareMatrix<double> *rhs)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  data_type extraout_RDX;
  long lVar4;
  int64_t i;
  long lVar5;
  SquareMatrix<double> SVar6;
  
  lVar1 = rhs->size_;
  if (lVar1 == lhs->size_) {
    if (0 < lVar1) {
      pdVar2 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      pdVar3 = (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      lVar4 = 0;
      do {
        lVar5 = 0;
        do {
          pdVar3[lVar5] = pdVar2[lVar5] + pdVar3[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + lVar1;
        pdVar2 = pdVar2 + lVar1;
      } while (lVar4 != lVar1);
    }
    SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,lhs);
    SVar6.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    SVar6.size_ = (size_type_conflict)this;
    return SVar6;
  }
  __assert_fail("rhs.size() == size_",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x98,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator+=(const SquareMatrix<T> &) [T = double]"
               );
}

Assistant:

inline int64_t rows() const { return size_ ; }